

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_common.hpp
# Opt level: O0

void __thiscall
chaiscript::exception::load_module_error::load_module_error
          (load_module_error *this,string *t_name,
          vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
          *t_errors)

{
  string local_40;
  vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
  *local_20;
  vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
  *t_errors_local;
  string *t_name_local;
  load_module_error *this_local;
  
  local_20 = t_errors;
  t_errors_local =
       (vector<chaiscript::exception::load_module_error,_std::allocator<chaiscript::exception::load_module_error>_>
        *)t_name;
  t_name_local = (string *)this;
  format_error(&local_40,t_name,t_errors);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)this = &PTR__load_module_error_008766f0;
  return;
}

Assistant:

load_module_error(const std::string &t_name, const std::vector<load_module_error> &t_errors)
          : std::runtime_error(format_error(t_name, t_errors)) {
      }